

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt__isfont(stbtt_uint8 *font)

{
  byte bVar1;
  
  bVar1 = *font;
  if (bVar1 < 0x4f) {
    if (bVar1 == 0) {
      if (font[1] != '\x01') {
        return 0;
      }
    }
    else {
      if (bVar1 != 0x31) {
        return 0;
      }
      if (font[1] != '\0') {
        return 0;
      }
    }
    if ((font[2] == '\0') && (font[3] == '\0')) {
      return 1;
    }
  }
  else if (bVar1 == 0x4f) {
    if (((font[1] == 'T') && (font[2] == 'T')) && (font[3] == 'O')) {
      return 1;
    }
  }
  else if (bVar1 == 0x74) {
    if (font[1] == 'r') {
      if ((font[2] == 'u') && (font[3] == 'e')) {
        return 1;
      }
    }
    else if (((font[1] == 'y') && (font[2] == 'p')) && (font[3] == '1')) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int stbtt__isfont(stbtt_uint8 *font)
{
   // check the version number
   if (stbtt_tag4(font, '1',0,0,0))  return 1; // TrueType 1
   if (stbtt_tag(font, "typ1"))   return 1; // TrueType with type 1 font -- we don't support this!
   if (stbtt_tag(font, "OTTO"))   return 1; // OpenType with CFF
   if (stbtt_tag4(font, 0,1,0,0)) return 1; // OpenType 1.0
   if (stbtt_tag(font, "true"))   return 1; // Apple specification for TrueType fonts
   return 0;
}